

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

void outlet_bang(_outlet *x)

{
  _outconnect *local_18;
  _outconnect *oc;
  _outlet *x_local;
  
  stackcount = stackcount + 1;
  if (stackcount < 1000) {
    for (local_18 = x->o_connections; local_18 != (_outconnect *)0x0; local_18 = local_18->oc_next)
    {
      pd_bang(local_18->oc_to);
    }
  }
  else {
    outlet_stackerror(x);
  }
  stackcount = stackcount + -1;
  return;
}

Assistant:

void outlet_bang(t_outlet *x)
{
    t_outconnect *oc;
    if(++stackcount >= STACKITER)
        outlet_stackerror(x);
    else
    for (oc = x->o_connections; oc; oc = oc->oc_next)
        pd_bang(oc->oc_to);
    --stackcount;
}